

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

char * LLVMBC::to_string(Predicate pred)

{
  char *pcStack_10;
  Predicate pred_local;
  
  switch(pred) {
  case FCMP_FALSE:
    pcStack_10 = "false";
    break;
  case FCMP_OEQ:
    pcStack_10 = "oeq";
    break;
  case FCMP_OGT:
    pcStack_10 = "ogt";
    break;
  case FCMP_OGE:
    pcStack_10 = "oge";
    break;
  case FCMP_OLT:
    pcStack_10 = "olt";
    break;
  case FCMP_OLE:
    pcStack_10 = "ole";
    break;
  case FCMP_ONE:
    pcStack_10 = "one";
    break;
  case FCMP_ORD:
    pcStack_10 = "ord";
    break;
  case FCMP_UNO:
    pcStack_10 = "uno";
    break;
  case FCMP_UEQ:
    pcStack_10 = "ueq";
    break;
  case FCMP_UGT:
    pcStack_10 = "ugt";
    break;
  case FCMP_UGE:
    pcStack_10 = "uge";
    break;
  case FCMP_ULT:
    pcStack_10 = "ult";
    break;
  case FCMP_ULE:
    pcStack_10 = "ule";
    break;
  case FCMP_UNE:
    pcStack_10 = "une";
    break;
  case FCMP_TRUE:
    pcStack_10 = "true";
    break;
  default:
    pcStack_10 = "???";
    break;
  case ICMP_EQ:
    pcStack_10 = "eq";
    break;
  case ICMP_NE:
    pcStack_10 = "ne";
    break;
  case ICMP_UGT:
    pcStack_10 = "ugt";
    break;
  case ICMP_UGE:
    pcStack_10 = "uge";
    break;
  case ICMP_ULT:
    pcStack_10 = "ult";
    break;
  case ICMP_ULE:
    pcStack_10 = "ule";
    break;
  case ICMP_SGT:
    pcStack_10 = "sgt";
    break;
  case ICMP_SGE:
    pcStack_10 = "sge";
    break;
  case ICMP_SLT:
    pcStack_10 = "slt";
    break;
  case ICMP_SLE:
    pcStack_10 = "sle";
  }
  return pcStack_10;
}

Assistant:

static const char *to_string(Instruction::Predicate pred)
{
	switch (pred)
	{
#define PRED(op, str)            \
	case Instruction::FCMP_##op: \
		return str
		PRED(FALSE, "false");
		PRED(OEQ, "oeq");
		PRED(OGT, "ogt");
		PRED(OGE, "oge");
		PRED(OLT, "olt");
		PRED(OLE, "ole");
		PRED(ONE, "one");
		PRED(ORD, "ord");
		PRED(UNO, "uno");
		PRED(UEQ, "ueq");
		PRED(UGT, "ugt");
		PRED(UGE, "uge");
		PRED(ULT, "ult");
		PRED(ULE, "ule");
		PRED(UNE, "une");
		PRED(TRUE, "true");
#undef PRED
#define PRED(op, str)            \
	case Instruction::ICMP_##op: \
		return str
		PRED(EQ, "eq");
		PRED(NE, "ne");
		PRED(UGT, "ugt");
		PRED(UGE, "uge");
		PRED(ULT, "ult");
		PRED(ULE, "ule");
		PRED(SGT, "sgt");
		PRED(SGE, "sge");
		PRED(SLT, "slt");
		PRED(SLE, "sle");
	}
#undef PRED
	return "???";
}